

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImFontAtlasCustomRect>::push_back
          (ImVector<ImFontAtlasCustomRect> *this,ImFontAtlasCustomRect *v)

{
  undefined8 uVar1;
  ImFontAtlasCustomRect *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImFontAtlasCustomRect> *in_RDI;
  ImVector<ImFontAtlasCustomRect> *unaff_retaddr;
  ImVector<ImFontAtlasCustomRect> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data + in_RDI->Size;
  uVar1 = *in_RSI;
  pIVar2->Width = (short)uVar1;
  pIVar2->Height = (short)((ulong)uVar1 >> 0x10);
  pIVar2->X = (short)((ulong)uVar1 >> 0x20);
  pIVar2->Y = (short)((ulong)uVar1 >> 0x30);
  uVar1 = in_RSI[1];
  pIVar2->GlyphID = (int)uVar1;
  pIVar2->GlyphAdvanceX = (float)(int)((ulong)uVar1 >> 0x20);
  pIVar2->GlyphOffset = *(ImVec2 *)(in_RSI + 2);
  pIVar2->Font = (ImFont *)in_RSI[3];
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }